

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O3

void borg_formula_error(char *section,char *full_line,char *section_label,char *error)

{
  char *pcVar1;
  
  borg_note("** borg formula failure ** ");
  pcVar1 = format("** error on line \'%s\'",full_line);
  borg_note(pcVar1);
  pcVar1 = format("** error for section %s \'%s\'",section_label,section);
  borg_note(pcVar1);
  if (error != (char *)0x0) {
    borg_note(error);
  }
  borg_note("** formulas disabled ** ");
  return;
}

Assistant:

void borg_formula_error(const char *section, const char *full_line,
    const char *section_label, const char *error)
{
    borg_note("** borg formula failure ** ");
    borg_note(format("** error on line '%s'", full_line));
    borg_note(format("** error for section %s '%s'", section_label, section));
    if (error)
        borg_note(error);
    borg_note("** formulas disabled ** ");
}